

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

uint64_t protect_next(refs_table_t *tbl,uint64_t **_bucket,size_t end)

{
  uint64_t uVar1;
  uint64_t d;
  uint64_t result;
  uint64_t *bucket;
  size_t end_local;
  uint64_t **_bucket_local;
  refs_table_t *tbl_local;
  
  result = (uint64_t)*_bucket;
  uVar1 = *(uint64_t *)result;
  do {
    result = result + 8;
    if ((uint64_t *)result == tbl->refs_table + end) {
      *_bucket = (uint64_t *)0x0;
      return uVar1;
    }
  } while ((*(long *)result == 0) || (*(long *)result == 0x7fffffffffffffff));
  *_bucket = (uint64_t *)result;
  return uVar1;
}

Assistant:

uint64_t
protect_next(refs_table_t *tbl, uint64_t **_bucket, size_t end)
{
    _Atomic(uint64_t)* bucket = (_Atomic(uint64_t)*) *_bucket;
    // assert(bucket != NULL);
    // assert(end <= tbl->refs_size);
    uint64_t result = *bucket;
    bucket++;
    while (bucket != tbl->refs_table + end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) {
            *_bucket = (uint64_t*)bucket;
            return result;
        }
        bucket++;
    }
    *_bucket = NULL;
    return result;
}